

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_14::XmlReporter::log_message(XmlReporter *this,MessageData *mb)

{
  XmlWriter *this_00;
  char *pcVar1;
  allocator<char> aStack_a8;
  allocator<char> local_a7;
  allocator<char> local_a6;
  allocator<char> local_a5;
  uint local_a4;
  undefined1 local_a0 [32];
  string local_80;
  string local_60;
  string local_40;
  
  std::mutex::lock(&this->mutex);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_a0 + 0x40),"Message",&local_a5);
  this_00 = &this->xml;
  XmlWriter::startElement(this_00,(string *)(local_a0 + 0x40));
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_a0 + 0x20),"type",&local_a6);
  pcVar1 = failureString(mb->m_severity);
  XmlWriter::writeAttribute(this_00,(string *)(local_a0 + 0x20),pcVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"filename",&local_a7);
  pcVar1 = skipPathFromFilename(mb->m_file);
  XmlWriter::writeAttribute(this_00,(string *)local_a0,pcVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"line",&aStack_a8);
  local_a4 = 0;
  if (this->opt->no_line_numbers == false) {
    local_a4 = mb->m_line;
  }
  XmlWriter::writeAttribute<unsigned_int>(this_00,&local_40,&local_a4);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)(local_a0 + 0x20));
  std::__cxx11::string::~string((string *)(local_a0 + 0x40));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_a0 + 0x40),"Text",(allocator<char> *)&local_40);
  XmlWriter::scopedElement((XmlWriter *)local_a0,(string *)this_00);
  if ((mb->m_string).field_0.buf[0x17] < '\0') {
    mb = (MessageData *)(mb->m_string).field_0.data.ptr;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_a0 + 0x20),(char *)mb,(allocator<char> *)&local_a4);
  XmlWriter::ScopedElement::writeText((ScopedElement *)local_a0,(string *)(local_a0 + 0x20),true);
  std::__cxx11::string::~string((string *)(local_a0 + 0x20));
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a0);
  std::__cxx11::string::~string((string *)(local_a0 + 0x40));
  log_contexts(this);
  XmlWriter::endElement(this_00);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void log_message(const MessageData& mb) override {
            std::lock_guard<std::mutex> lock(mutex);

            xml.startElement("Message")
                    .writeAttribute("type", failureString(mb.m_severity))
                    .writeAttribute("filename", skipPathFromFilename(mb.m_file))
                    .writeAttribute("line", line(mb.m_line));

            xml.scopedElement("Text").writeText(mb.m_string.c_str());

            log_contexts();

            xml.endElement();
        }